

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O2

void __thiscall
Potassco::AspifOutput::theoryAtom
          (AspifOutput *this,Id_t atomOrZero,Id_t termId,IdSpan *elements,Id_t op,Id_t rhs)

{
  startDir(this,(Directive_t)0x9);
  add(this,6);
  add(this,atomOrZero);
  add(this,termId);
  add(this,elements);
  add(this,op);
  add(this,rhs);
  endDir(this);
  return;
}

Assistant:

void AspifOutput::theoryAtom(Id_t atomOrZero, Id_t termId, const IdSpan& elements, Id_t op, Id_t rhs) {
	startDir(Directive_t::Theory).add(Theory_t::AtomWithGuard).add(atomOrZero).add(termId).add(elements).add(op).add(rhs).endDir();
}